

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetFileArtifactResultGetter<ArtifactImportFileSuffixTag>::Get_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFileArtifactResultGetter<ArtifactImportFileSuffixTag> *this,
          cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *param_3)

{
  bool bVar1;
  _Rb_tree_header *config;
  
  config = &(target->LinkOptionsCache)._M_t._M_impl.super__Rb_tree_header;
  bVar1 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)this,(string *)config);
  if (bVar1) {
    cmGeneratorTarget::GetFileSuffix
              (__return_storage_ptr__,(cmGeneratorTarget *)this,(string *)config,
               ImportLibraryArtifact);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Get(cmGeneratorTarget* target,
                         cmGeneratorExpressionContext* context,
                         const GeneratorExpressionContent*)
  {
    if (target->HasImportLibrary(context->Config)) {
      return target->GetFileSuffix(context->Config,
                                   cmStateEnums::ImportLibraryArtifact);
    }
    return std::string{};
  }